

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::Parse
          (AsciiParser *this,uint32_t load_states,AsciiParserOption *parser_option)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  StreamReader *pSVar5;
  long *plVar6;
  ulong uVar7;
  size_type *psVar8;
  long lVar9;
  char *pcVar10;
  Specifier spec;
  Identifier tok;
  char c;
  ostringstream ss_e;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  value_type local_1a8 [3];
  ios_base local_138 [264];
  
  bVar1 = (byte)load_states;
  this->_toplevel = (bool)(bVar1 & 1);
  this->_sub_layered = (bool)(bVar1 >> 1 & 1);
  this->_referenced = (bool)((byte)(load_states >> 2) & 1);
  this->_payloaded = (bool)(bVar1 >> 3 & 1);
  bVar2 = parser_option->allow_unknown_apiSchema;
  (this->_option).allow_unknown_prim = parser_option->allow_unknown_prim;
  (this->_option).allow_unknown_apiSchema = bVar2;
  (this->_option).strict_allowedToken_check = parser_option->strict_allowedToken_check;
  bVar2 = ParseMagicHeader(this);
  if (bVar2) {
    SkipCommentAndWhitespaceAndNewline(this,true);
    pSVar5 = this->_sr;
    if (pSVar5->length_ <= pSVar5->idx_) {
      return true;
    }
    if (pSVar5->binary_[pSVar5->idx_] == '\0') {
      return true;
    }
    bVar2 = LookChar1(this,(char *)&local_1e8);
    if (!bVar2) {
      return false;
    }
    if (((char)local_1e8._M_dataplus._M_p != '(') || (bVar2 = ParseStageMetas(this), bVar2)) {
      if ((this->_stage_meta_process_fun).super__Function_base._M_manager == (_Manager_type)0x0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Parse",5);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x142e);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Stage metadata processing callback is not set.",0x2e);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushWarn(this,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,
                          CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                   local_208.field_2._M_local_buf[0]) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
      }
      else {
        bVar2 = (*(this->_stage_meta_process_fun)._M_invoker)
                          ((_Any_data *)&this->_stage_meta_process_fun,&this->_stage_metas);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Parse",5);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x142a);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pcVar10 = "Failed to reconstruct Stage metas.";
          lVar9 = 0x22;
          goto LAB_003a9183;
        }
      }
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"/","");
      ::std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->_path_stack).c,local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      pSVar5 = this->_sr;
      uVar7 = pSVar5->idx_;
      if (pSVar5->length_ <= uVar7) {
        return true;
      }
      do {
        if (pSVar5->binary_[uVar7] == '\0') {
          return true;
        }
        bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar2) {
          return false;
        }
        pSVar5 = this->_sr;
        uVar7 = pSVar5->idx_;
        if (pSVar5->length_ <= uVar7) {
          return true;
        }
        if (pSVar5->binary_[uVar7] == '\0') {
          return true;
        }
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        local_208._M_string_length = 0;
        local_208.field_2._M_local_buf[0] = '\0';
        bVar2 = ReadBasicType(this,(Identifier *)&local_208);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Parse",5);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x1443);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pcVar10 = "Identifier expected.\n";
          lVar9 = 0x15;
LAB_003a96a0:
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,lVar9);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
LAB_003a96bc:
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_1e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
LAB_003a9711:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p == &local_208.field_2) {
            return false;
          }
          operator_delete(local_208._M_dataplus._M_p,
                          CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                   local_208.field_2._M_local_buf[0]) + 1);
          return false;
        }
        if (this->_sr->length_ < uVar7) goto LAB_003a9711;
        this->_sr->idx_ = uVar7;
        iVar3 = ::std::__cxx11::string::compare((char *)&local_208);
        if (iVar3 != 0) {
          iVar3 = ::std::__cxx11::string::compare((char *)&local_208);
          if (iVar3 == 0) {
            spec = Over;
            goto LAB_003a9443;
          }
          iVar3 = ::std::__cxx11::string::compare((char *)&local_208);
          spec = Class;
          if (iVar3 == 0) goto LAB_003a9443;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Parse",5);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x1453);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          ::std::operator+(&local_1c8,"Invalid specifier token \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_208);
          plVar6 = (long *)::std::__cxx11::string::append((char *)&local_1c8);
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_1e8.field_2._M_allocated_capacity = *psVar8;
            local_1e8.field_2._8_8_ = plVar6[3];
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          }
          else {
            local_1e8.field_2._M_allocated_capacity = *psVar8;
            local_1e8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_1e8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                              local_1e8._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_003a96bc;
        }
        spec = Def;
LAB_003a9443:
        local_1a8[0]._M_dataplus._M_p = (pointer)0xffffffffffffffff;
        if ((this->_prim_idx_assign_fun).super__Function_base._M_manager == (_Manager_type)0x0) {
          ::std::__throw_bad_function_call();
        }
        lVar9 = (*(this->_prim_idx_assign_fun)._M_invoker)
                          ((_Any_data *)&this->_prim_idx_assign_fun,(long *)local_1a8);
        bVar2 = ParseBlock(this,spec,lVar9,-1,0,false);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Parse",5);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x145c);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pcVar10 = "Failed to parse `def` block.";
          lVar9 = 0x1c;
          goto LAB_003a96a0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,
                          CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                   local_208.field_2._M_local_buf[0]) + 1);
        }
        pSVar5 = this->_sr;
        uVar7 = pSVar5->idx_;
        if (pSVar5->length_ <= uVar7) {
          return true;
        }
      } while( true );
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Parse",5);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x1421);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar10 = "Failed to parse Stage metas.";
    lVar9 = 0x1c;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Parse",5);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x140e);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar10 = "Failed to parse USDA magic header.\n";
    lVar9 = 0x23;
  }
LAB_003a9183:
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,lVar9);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  ::std::__cxx11::stringbuf::str();
  PushError(this,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool AsciiParser::Parse(const uint32_t load_states,
                        const AsciiParserOption &parser_option) {
  _toplevel = (load_states & static_cast<uint32_t>(LoadState::Toplevel));
  _sub_layered = (load_states & static_cast<uint32_t>(LoadState::Sublayer));
  _referenced = (load_states & static_cast<uint32_t>(LoadState::Reference));
  _payloaded = (load_states & static_cast<uint32_t>(LoadState::Payload));
  _option = parser_option;

  bool header_ok = ParseMagicHeader();
  if (!header_ok) {
    PUSH_ERROR_AND_RETURN("Failed to parse USDA magic header.\n");
  }

  SkipCommentAndWhitespaceAndNewline();

  if (Eof()) {
    // Empty USDA
    return true;
  }

  {
    char c;
    if (!LookChar1(&c)) {
      return false;
    }

    if (c == '(') {
      // stage meta.
      if (!ParseStageMetas()) {
        PUSH_ERROR_AND_RETURN("Failed to parse Stage metas.");
      }
    }
  }

  if (_stage_meta_process_fun) {
    DCOUT("Invoke StageMeta callback.");
    bool ret = _stage_meta_process_fun(_stage_metas);
    if (!ret) {
      PUSH_ERROR_AND_RETURN("Failed to reconstruct Stage metas.");
    }
  } else {
    // TODO: Report error when StageMeta callback is not set?
    PUSH_WARN("Stage metadata processing callback is not set.");
  }

  PushPrimPath("/");

  // parse blocks
  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    if (Eof()) {
      // Whitespaces in the end of line.
      break;
    }

    // Look ahead token
    auto curr_loc = _sr->tell();

    Identifier tok;
    if (!ReadBasicType(&tok)) {
      PUSH_ERROR_AND_RETURN("Identifier expected.\n");
    }

    // Rewind
    if (!SeekTo(curr_loc)) {
      return false;
    }

    Specifier spec{Specifier::Invalid};
    if (tok == "def") {
      spec = Specifier::Def;
    } else if (tok == "over") {
      spec = Specifier::Over;
    } else if (tok == "class") {
      spec = Specifier::Class;
    } else {
      PUSH_ERROR_AND_RETURN("Invalid specifier token '" + tok + "'");
    }

    int64_t primIdx = _prim_idx_assign_fun(-1);
    DCOUT("Enter parseDef. primIdx = " << primIdx
                                       << ", parentPrimIdx = root(-1)");
    bool block_ok = ParseBlock(spec, primIdx, /* parent */ -1, /* depth */ 0,
                               /* in_variantStmt */ false);
    if (!block_ok) {
      PUSH_ERROR_AND_RETURN("Failed to parse `def` block.");
    }
  }

  return true;
}